

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O3

Float * __thiscall blc::math::Float::operator-(Float *__return_storage_ptr__,Float *this,Float *i)

{
  uint uVar1;
  double dVar2;
  Float local_30;
  
  Float(__return_storage_ptr__);
  dVar2 = i->_nb;
  for (uVar1 = this->_E - i->_E; uVar1 != 0; uVar1 = uVar1 + ((int)~uVar1 >> 0x1f | 1U)) {
    if ((int)uVar1 < 0) {
      dVar2 = dVar2 * 10.0;
    }
    else {
      dVar2 = dVar2 / 10.0;
    }
  }
  Float(&local_30,this->_nb - dVar2,this->_E);
  __return_storage_ptr__->_nb = local_30._nb;
  __return_storage_ptr__->_E = local_30._E;
  return __return_storage_ptr__;
}

Assistant:

blc::math::Float blc::math::Float::operator-(const blc::math::Float &i) const {
	blc::math::Float ret;
	int diff = this->_E - i.getE();
	double tmp = i.getNb();

	while (diff != 0) {
		if (diff < 0) {
			tmp *= 10;
			diff++;
		} else {
			tmp /= 10;
			diff--;
		}
	}
	ret = blc::math::Float(this->_nb - tmp, this->_E);
	return (ret);
}